

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrinterTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupPrinter::~TEST_GROUP_CppUTestGroupPrinter
          (TEST_GROUP_CppUTestGroupPrinter *this)

{
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_GROUP(Printer)
{
    Printer* printer;
    MockPrinter* mockPrinter;

    void setup() _override
    {
        mockPrinter = new MockPrinter();
        printer = mockPrinter;
    }
    void teardown() _override
    {
        delete printer;
    }
}